

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O0

void __thiscall WindowPrivate::WindowPrivate(WindowPrivate *this,Window *parent)

{
  Window *parent_local;
  WindowPrivate *this_local;
  
  this->q = parent;
  this->stack = (QStackedWidget *)0x0;
  this->imageList = (ImageList *)0x0;
  QList<QString>::QList(&this->imageFiles);
  this->futureWatcher = (QFutureWatcher<QImage> *)0x0;
  QFuture<QImage>::QFuture(&this->future);
  QFuture<QList<QString>_>::QFuture(&this->fileFuture);
  this->filesFutureWatcher = (QFutureWatcher<QList<QString>_> *)0x0;
  QList<QString>::QList(&this->imageLocations);
  return;
}

Assistant:

WindowPrivate( Window * parent )
		:	q( parent )
		,	stack( 0 )
		,	imageList( 0 )
		,	futureWatcher( 0 )
		,	filesFutureWatcher( 0 )
	{
	}